

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# egluUtil.cpp
# Opt level: O2

vector<int,_std::allocator<int>_> *
eglu::toLegacyAttribList
          (vector<int,_std::allocator<int>_> *__return_storage_ptr__,EGLAttrib *attribs)

{
  ulong uVar1;
  InternalError *this;
  int local_2c;
  int local_28 [2];
  
  (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (attribs != (EGLAttrib *)0x0) {
    for (; uVar1 = *attribs, uVar1 != 0x3038; attribs = (EGLAttrib *)((ulong *)attribs + 2)) {
      if ((uVar1 >> 0x20 != 0) || (*(int *)((long)attribs + 0xc) != 0)) {
        this = (InternalError *)__cxa_allocate_exception(0x38);
        tcu::InternalError::InternalError
                  (this,"Failed to translate EGLAttrib to EGLint",(char *)0x0,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/egl/egluUtil.cpp"
                   ,0x1ac);
        __cxa_throw(this,&tcu::InternalError::typeinfo,tcu::Exception::~Exception);
      }
      local_28[0] = (int)uVar1;
      std::vector<int,_std::allocator<int>_>::emplace_back<int>(__return_storage_ptr__,local_28);
      local_2c = (int)((ulong *)attribs)[1];
      std::vector<int,_std::allocator<int>_>::emplace_back<int>(__return_storage_ptr__,&local_2c);
    }
  }
  local_28[1] = 0x3038;
  std::vector<int,_std::allocator<int>_>::emplace_back<int>(__return_storage_ptr__,local_28 + 1);
  return __return_storage_ptr__;
}

Assistant:

vector<EGLint> toLegacyAttribList (const EGLAttrib* attribs)
{
	const deUint64	attribMask		= 0xffffffffull;	//!< Max bits that can be used
	vector<EGLint>	legacyAttribs;

	if (attribs)
	{
		for (const EGLAttrib* attrib = attribs; *attrib != EGL_NONE; attrib += 2)
		{
			if ((attrib[0] & ~attribMask) || (attrib[1] & ~attribMask))
				throw tcu::InternalError("Failed to translate EGLAttrib to EGLint", DE_NULL, __FILE__, __LINE__);

			legacyAttribs.push_back((EGLint)attrib[0]);
			legacyAttribs.push_back((EGLint)attrib[1]);
		}
	}

	legacyAttribs.push_back(EGL_NONE);

	return legacyAttribs;
}